

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

cubeb_device_fmt pulse_format_to_cubeb_format(pa_sample_format_t format)

{
  cubeb_device_fmt cVar1;
  
  cVar1 = CUBEB_DEVICE_FMT_F32LE;
  if ((uint)(format + ~PA_SAMPLE_ULAW) < 4) {
    cVar1 = *(cubeb_device_fmt *)(&DAT_001354f0 + (ulong)(uint)(format + ~PA_SAMPLE_ULAW) * 4);
  }
  return cVar1;
}

Assistant:

static cubeb_device_fmt
pulse_format_to_cubeb_format(pa_sample_format_t format)
{
  switch (format) {
  case PA_SAMPLE_S16LE:
    return CUBEB_DEVICE_FMT_S16LE;
  case PA_SAMPLE_S16BE:
    return CUBEB_DEVICE_FMT_S16BE;
  case PA_SAMPLE_FLOAT32LE:
    return CUBEB_DEVICE_FMT_F32LE;
  case PA_SAMPLE_FLOAT32BE:
    return CUBEB_DEVICE_FMT_F32BE;
  default:
    return CUBEB_DEVICE_FMT_F32NE;
  }
}